

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS quilt(REF_MPI ref_mpi,int argc,char **argv)

{
  REF_BOOL RVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  double *pdVar6;
  undefined8 uVar7;
  size_t sVar8;
  char *pcVar9;
  double dVar10;
  REF_INT pos;
  REF_GEOM ref_geom;
  char project [1000];
  char output_egads [1024];
  int local_84c;
  double *local_848;
  REF_GEOM local_840;
  double local_838;
  undefined8 local_830;
  char local_828 [1008];
  char local_438 [1032];
  
  if (argc < 3) {
    if (ref_mpi->id != 0) {
      return 1;
    }
    quilt_help(*argv);
    return 1;
  }
  pcVar9 = argv[2];
  RVar1 = ref_egads_allows_construction();
  if (RVar1 == 0) {
    pcVar9 = "EGADS not linked with OpenCASCADE, required to load model";
    uVar7 = 0x1022;
  }
  else {
    RVar1 = ref_egads_allows_effective();
    if (RVar1 == 0) {
      pcVar9 = "EGADS does not support Effective Geometry";
      uVar7 = 0x1023;
    }
    else {
      sVar5 = strlen(pcVar9);
      if (7 < sVar5) {
        sVar8 = 0x3ff;
        if (sVar5 < 0x3ff) {
          sVar8 = sVar5;
        }
        iVar2 = strncmp(pcVar9 + (sVar8 - 6),".egads",6);
        if (iVar2 == 0) {
          strncpy(local_828,pcVar9,sVar8 - 6);
          local_828[sVar8 - 6] = '\0';
          snprintf(local_438,0x400,"%s-eff.egads",local_828);
          uVar3 = ref_args_find(argc,argv,"--global",&local_84c);
          iVar2 = local_84c;
          if ((uVar3 != 0) && (uVar3 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x102d,"quilt",(ulong)uVar3,"arg search");
            return uVar3;
          }
          if (local_84c < argc + -3 && local_84c != -1) {
            pdVar6 = (double *)malloc(0x18);
            if (pdVar6 == (double *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x102f,"quilt","malloc global_params of REF_DBL NULL");
              return 2;
            }
            local_848 = (double *)(long)iVar2;
            local_830 = atof(argv[(long)local_848 + 1]);
            *pdVar6 = local_830;
            local_838 = atof(argv[(long)local_848 + 2]);
            pdVar6[1] = local_838;
            dVar10 = atof(argv[(long)local_848 + 3]);
            pdVar6[2] = dVar10;
            local_848 = pdVar6;
            if (ref_mpi->id == 0) {
              printf("initial tessellation, global param %f %f %f\n",local_830,local_838,
                     SUB84(dVar10,0));
            }
          }
          else {
            if (ref_mpi->id == 0) {
              puts("initial tessellation, default param");
            }
            local_848 = (double *)0x0;
          }
          uVar4 = ref_args_find(argc,argv,"--auto-tparams",&local_84c);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x103b,"quilt",(ulong)uVar4,"arg search");
            uVar3 = uVar4;
          }
          if ((uVar4 != 5) && (uVar4 != 0)) {
            return uVar3;
          }
          uVar3 = 1;
          if (local_84c < argc + -1 && local_84c != -1) {
            uVar3 = atoi(argv[(long)local_84c + 1]);
            if (ref_mpi->id == 0) {
              printf("--auto-tparams %d requested\n",(ulong)uVar3);
            }
            if (((int)uVar3 < 0) && (uVar3 = 7, ref_mpi->id == 0)) {
              printf("--auto-tparams %d set to all\n",7);
            }
          }
          uVar4 = ref_geom_create(&local_840);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x1047,"quilt",(ulong)uVar4,"create geom");
            return uVar4;
          }
          uVar4 = ref_egads_load(local_840,pcVar9);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x1048,"quilt",(ulong)uVar4,"load");
            return uVar4;
          }
          if ((ref_mpi->id == 0) && (local_840->effective != 0)) {
            puts("EBody Effective Body loaded");
          }
          pdVar6 = local_848;
          uVar3 = ref_egads_quilt(local_840,uVar3,local_848);
          if (uVar3 == 0) {
            uVar3 = ref_egads_save(local_840,local_438);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x104c,"quilt",(ulong)uVar3,"save");
              return uVar3;
            }
            uVar3 = ref_geom_free(local_840);
            if (uVar3 == 0) {
              if (pdVar6 == (REF_DBL *)0x0) {
                return 0;
              }
              free(pdVar6);
              return 0;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x104d,"quilt",(ulong)uVar3,"free geom/context");
            return uVar3;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x104b,"quilt",(ulong)uVar3,"quilt");
          return uVar3;
        }
      }
      pcVar9 = ".egads extension missing";
      uVar7 = 0x1028;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar7,"quilt",pcVar9);
  return 1;
}

Assistant:

static REF_STATUS quilt(REF_MPI ref_mpi, int argc, char *argv[]) {
  REF_GEOM ref_geom;
  char *input_egads;
  size_t end_of_string;
  char project[1000];
  char output_egads[1024];
  REF_INT pos;
  REF_DBL *global_params = NULL;
  REF_INT auto_tparams = REF_EGADS_RECOMMENDED_TPARAM;

  if (argc < 3) goto shutdown;
  input_egads = argv[2];

  RAS(ref_egads_allows_construction(),
      "EGADS not linked with OpenCASCADE, required to load model")
  RAS(ref_egads_allows_effective(), "EGADS does not support Effective Geometry")

  end_of_string = MIN(1023, strlen(input_egads));
  RAS((7 < end_of_string &&
       strncmp(&(input_egads[end_of_string - 6]), ".egads", 6) == 0),
      ".egads extension missing");
  strncpy(project, input_egads, end_of_string - 6);
  project[end_of_string - 6] = '\0';
  snprintf(output_egads, 1024, "%s-eff.egads", project);

  RXS(ref_args_find(argc, argv, "--global", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos < argc - 3) {
    ref_malloc(global_params, 3, REF_DBL);
    global_params[0] = atof(argv[pos + 1]);
    global_params[1] = atof(argv[pos + 2]);
    global_params[2] = atof(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi))
      printf("initial tessellation, global param %f %f %f\n", global_params[0],
             global_params[1], global_params[2]);
  } else {
    if (ref_mpi_once(ref_mpi)) printf("initial tessellation, default param\n");
  }

  RXS(ref_args_find(argc, argv, "--auto-tparams", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    auto_tparams = atoi(argv[pos + 1]);
    if (ref_mpi_once(ref_mpi))
      printf("--auto-tparams %d requested\n", auto_tparams);
    if (auto_tparams < 0) {
      auto_tparams = REF_EGADS_ALL_TPARAM;
      if (ref_mpi_once(ref_mpi))
        printf("--auto-tparams %d set to all\n", auto_tparams);
    }
  }

  RSS(ref_geom_create(&ref_geom), "create geom");
  RSS(ref_egads_load(ref_geom, input_egads), "load");
  if (ref_mpi_once(ref_mpi) && ref_geom_effective(ref_geom))
    printf("EBody Effective Body loaded\n");
  RSS(ref_egads_quilt(ref_geom, auto_tparams, global_params), "quilt");
  RSS(ref_egads_save(ref_geom, output_egads), "save");
  RSS(ref_geom_free(ref_geom), "free geom/context");

  ref_free(global_params);
  global_params = NULL;

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) quilt_help(argv[0]);
  return REF_FAILURE;
}